

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O2

CURLcode glob_url(URLGlob **glob,char *url,unsigned_long *urlnum,FILE *error)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  FILE *pFVar8;
  bool bVar9;
  byte bVar10;
  char cVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  size_t sVar15;
  char *pcVar16;
  URLGlob *glob_00;
  long lVar17;
  char **ppcVar18;
  char *__dest;
  int *piVar19;
  undefined1 *puVar20;
  ulong uVar21;
  anon_union_40_3_e2f18bb4_for_content *paVar22;
  ulong uVar23;
  ulong uVar24;
  byte *pbVar25;
  anon_union_40_3_e2f18bb4_for_content *paVar26;
  byte *pbVar27;
  URLPattern *pUVar28;
  byte *pbVar29;
  CURLcode CVar30;
  bool bVar31;
  byte *local_2b8;
  ulong local_2a8;
  char end_c;
  char max_c;
  char min_c;
  byte *local_298;
  int local_28c;
  byte *local_288;
  anon_union_40_3_e2f18bb4_for_content *local_280;
  byte *local_278;
  long local_270;
  FILE *local_268;
  unsigned_long *local_260;
  byte *local_258;
  byte *local_250;
  URLPattern *local_248;
  URLGlob **local_240;
  char *endp;
  
  *glob = (URLGlob *)0x0;
  local_268 = error;
  local_260 = urlnum;
  local_258 = (byte *)url;
  sVar15 = strlen(url);
  pcVar16 = (char *)malloc(sVar15 + 1);
  if (pcVar16 != (char *)0x0) {
    *pcVar16 = '\0';
    local_2b8 = (byte *)0x1;
    local_240 = glob;
    glob_00 = (URLGlob *)calloc(1,0x12f0);
    if (glob_00 != (URLGlob *)0x0) {
      glob_00->urllen = sVar15;
      glob_00->glob_buffer = pcVar16;
      local_2a8 = 1;
      CVar30 = CURLE_OK;
      local_28c = 0;
      pbVar29 = local_258;
      do {
        if ((CVar30 != CURLE_OK) || (*pbVar29 == 0)) {
          if (CVar30 == CURLE_OK) {
            *local_260 = local_2a8;
            *local_240 = glob_00;
            return CURLE_OK;
          }
          goto LAB_0011ca84;
        }
        pbVar25 = (byte *)glob_00->glob_buffer;
        sVar15 = 0;
LAB_0011c0da:
        for (; bVar10 = *pbVar29, bVar10 == 0x5b; pbVar29 = pbVar29 + (long)pcVar16) {
          pcVar16 = strchr((char *)pbVar29,0x5d);
          if (((pcVar16 == (char *)0x0) ||
              (pcVar16 = pcVar16 + (1 - (long)pbVar29), (char *)0x7f < pcVar16)) ||
             (lVar17 = curl_url(), lVar17 == 0)) {
LAB_0011c159:
            pcVar16 = (char *)0x2;
            if (pbVar29[1] != 0x5d) goto LAB_0011c1f6;
          }
          else {
            memcpy(&endp,pbVar29,(size_t)pcVar16);
            *(char *)((long)&endp + (long)pcVar16) = '\0';
            iVar12 = curl_url_set(lVar17,0,&endp,0x200);
            curl_url_cleanup(lVar17);
            if (iVar12 != 0) goto LAB_0011c159;
            if (pcVar16 == (char *)0x0) goto LAB_0011c1f6;
          }
          memcpy(pbVar25,pbVar29,(size_t)pcVar16);
          pbVar25 = pbVar25 + (long)pcVar16;
          sVar15 = sVar15 + (long)pcVar16;
        }
        if (bVar10 != 0) {
          if (bVar10 != 0x5c) {
            if (bVar10 != 0x5d) {
              if (bVar10 == 0x7b) goto LAB_0011c1f6;
              if (bVar10 != 0x7d) goto LAB_0011c1de;
            }
            pcVar16 = "unmatched close brace/bracket";
            goto LAB_0011ca6d;
          }
          pbVar27 = pbVar29 + 1;
          bVar10 = 0x5c;
          uVar14 = *pbVar27 - 0x5b;
          if ((uVar14 < 0x23) && ((0x500000005U >> ((ulong)uVar14 & 0x3f) & 1) != 0)) {
            pbVar29 = pbVar29 + 1;
            local_2b8 = local_2b8 + 1;
            bVar10 = *pbVar27;
          }
LAB_0011c1de:
          pbVar29 = pbVar29 + 1;
          *pbVar25 = bVar10;
          pbVar25 = pbVar25 + 1;
          local_2b8 = local_2b8 + 1;
          sVar15 = sVar15 + 1;
          goto LAB_0011c0da;
        }
LAB_0011c1f6:
        uVar21 = local_2a8;
        if (sVar15 == 0) {
          CVar30 = CURLE_OK;
          if (*pbVar29 == 0x5b) {
            pbVar25 = pbVar29 + 1;
            local_2b8 = local_2b8 + 1;
            pUVar28 = glob_00->pattern + glob_00->size;
            glob_00->pattern[glob_00->size].globindex = local_28c;
            local_28c = local_28c + 1;
            iVar12 = Curl_isalpha((uint)pbVar29[1]);
            if (iVar12 == 0) {
              iVar12 = Curl_isdigit((uint)*pbVar25);
              if (iVar12 == 0) {
                glob_00->error = "bad range specification";
LAB_0011c781:
                glob_00->pos = (size_t)local_2b8;
                pbVar29 = pbVar25;
              }
              else {
                pUVar28->type = UPTNumRange;
                (pUVar28->content).NumRange.padlength = 0;
                if (*pbVar25 == 0x30) {
                  pbVar29 = pbVar29 + 2;
                  bVar10 = 0x30;
                  while (iVar12 = Curl_isdigit((uint)bVar10), iVar12 != 0) {
                    piVar19 = &(pUVar28->content).NumRange.padlength;
                    *piVar19 = *piVar19 + 1;
                    bVar10 = *pbVar29;
                    pbVar29 = pbVar29 + 1;
                  }
                }
                piVar19 = __errno_location();
                *piVar19 = 0;
                puVar20 = (undefined1 *)strtoul((char *)pbVar25,&endp,10);
                if (((*piVar19 == 0) && ((byte *)endp != pbVar25)) &&
                   (pbVar29 = (byte *)endp, *endp == '-')) {
                  do {
                    do {
                      pbVar29 = pbVar29 + 1;
                      bVar10 = *pbVar29;
                    } while (bVar10 == 0x20);
                  } while (bVar10 == 9);
                  iVar12 = Curl_isdigit((uint)bVar10);
                  if (iVar12 == 0) {
                    paVar22 = (anon_union_40_3_e2f18bb4_for_content *)0x0;
                  }
                  else {
                    *piVar19 = 0;
                    paVar22 = (anon_union_40_3_e2f18bb4_for_content *)
                              strtoul((char *)pbVar29,&endp,10);
                    if (*piVar19 == 0) {
                      cVar11 = *endp;
                      if (cVar11 == ':') {
                        pbVar29 = (byte *)(endp + 1);
                        *piVar19 = 0;
                        local_280 = paVar22;
                        uVar24 = strtoul((char *)pbVar29,&endp,10);
                        paVar22 = local_280;
                        if ((*piVar19 != 0) || (endp == (char *)0x0)) {
                          bVar31 = false;
                          goto LAB_0011c630;
                        }
                        cVar11 = *endp;
                      }
                      else {
                        uVar24 = 1;
                      }
                      if (cVar11 == ']') {
                        pbVar29 = (byte *)(endp + 1);
                        bVar31 = true;
                      }
                      else {
                        bVar31 = false;
                      }
                      goto LAB_0011c630;
                    }
                  }
                  bVar31 = false;
                  uVar24 = 0;
                }
                else {
                  bVar31 = false;
                  uVar24 = 0;
                  paVar22 = (anon_union_40_3_e2f18bb4_for_content *)0x0;
                  pbVar29 = pbVar25;
                }
LAB_0011c630:
                local_2b8 = pbVar29 + ((long)local_2b8 - (long)pbVar25);
                pcVar16 = "bad range";
                if (((bVar31) && (pcVar16 = "bad range", uVar24 != 0)) &&
                   (((anon_union_40_3_e2f18bb4_for_content *)puVar20 != paVar22 ||
                    (pcVar16 = "bad range", uVar24 == 1)))) {
                  uVar23 = (long)paVar22 - (long)puVar20;
                  if (uVar23 == 0) {
                    uVar23 = 0;
                  }
                  else {
                    pcVar16 = "bad range";
                    if ((paVar22 < puVar20) || (pcVar16 = "bad range", uVar23 < uVar24))
                    goto LAB_0011c66d;
                  }
                  (pUVar28->content).NumRange.min_n = (unsigned_long)puVar20;
                  (pUVar28->content).NumRange.ptr_n = (unsigned_long)puVar20;
                  (pUVar28->content).NumRange.max_n = (unsigned_long)paVar22;
                  (pUVar28->content).NumRange.step = uVar24;
                  uVar21 = 0;
                  uVar24 = uVar23 / uVar24 + 1;
                  if (uVar24 != 0) {
                    auVar4._8_8_ = 0;
                    auVar4._0_8_ = uVar24;
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = local_2a8;
                    uVar21 = SUB168(auVar4 * auVar7,0);
                    pcVar16 = "range overflow";
                    if (SUB168(auVar4 * auVar7,8) != 0) goto LAB_0011c66d;
                  }
                  CVar30 = CURLE_OK;
                  goto LAB_0011c78c;
                }
LAB_0011c66d:
                glob_00->error = pcVar16;
                glob_00->pos = (size_t)local_2b8;
                pbVar29 = pbVar25;
              }
            }
            else {
              pUVar28->type = UPTCharRange;
              iVar12 = __isoc99_sscanf(pbVar25,"%c-%c%c",&min_c,&max_c,&end_c);
              bVar31 = true;
              pbVar27 = pbVar25;
              bVar9 = true;
              if (iVar12 == 3) {
                if (end_c == ']') {
                  pbVar27 = pbVar29 + 5;
                  bVar9 = false;
                  goto LAB_0011c6cd;
                }
                uVar21 = 1;
                if (end_c == ':') {
                  piVar19 = __errno_location();
                  *piVar19 = 0;
                  uVar21 = strtoul((char *)(pbVar29 + 5),&endp,10);
                  if ((*piVar19 == 0) && (pbVar29 + 5 != (byte *)endp)) {
                    pbVar27 = (byte *)(endp + 1);
                    if (*endp != ']') {
                      uVar21 = 0;
                      pbVar27 = pbVar25;
                    }
                  }
                  else {
                    uVar21 = 0;
                  }
                  bVar31 = false;
                }
              }
              else {
LAB_0011c6cd:
                bVar31 = bVar9;
                uVar21 = 1;
              }
              local_2b8 = pbVar27 + ((long)local_2b8 - (long)pbVar25);
              pcVar16 = "bad range";
              if (((!bVar31) && (pcVar16 = "bad range", 0xffffffff80000000 < uVar21 - 0x80000000))
                 && ((min_c != max_c || (pcVar16 = "bad range", uVar21 == 1)))) {
                if (min_c == max_c) {
                  uVar14 = (int)max_c - (int)min_c;
LAB_0011c740:
                  (pUVar28->content).CharRange.step = (int)uVar21;
                  (pUVar28->content).CharRange.min_c = min_c;
                  (pUVar28->content).CharRange.ptr_c = min_c;
                  (pUVar28->content).CharRange.max_c = max_c;
                  iVar12 = (int)uVar14 / (int)uVar21 + 1;
                  pbVar29 = pbVar27;
                  if (iVar12 == 0) {
                    local_2a8 = 0;
                    uVar21 = local_2a8;
                  }
                  else {
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = (long)iVar12;
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = local_2a8;
                    pcVar16 = "range overflow";
                    uVar21 = SUB168(auVar3 * auVar6,0);
                    if (SUB168(auVar3 * auVar6,8) != 0) goto LAB_0011c719;
                  }
                  goto LAB_0011c78c;
                }
                pcVar16 = "bad range";
                if (min_c <= max_c) {
                  uVar14 = (int)max_c - (int)min_c;
                  pcVar16 = "bad range";
                  if (((int)uVar14 < 0x1a) && (pcVar16 = "bad range", uVar21 <= uVar14))
                  goto LAB_0011c740;
                }
              }
LAB_0011c719:
              glob_00->error = pcVar16;
              glob_00->pos = (size_t)local_2b8;
              pbVar29 = pbVar25;
            }
            CVar30 = CURLE_URL_MALFORMAT;
            uVar21 = local_2a8;
          }
          else if (*pbVar29 == 0x7b) {
            local_288 = pbVar29 + 1;
            local_278 = (byte *)glob_00->glob_buffer;
            sVar1 = glob_00->size;
            pUVar28 = glob_00->pattern + sVar1;
            glob_00->pattern[sVar1].type = UPTSet;
            paVar26 = &glob_00->pattern[sVar1].content;
            paVar22 = &glob_00->pattern[sVar1].content;
            (paVar22->Set).elements = (char **)0x0;
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar22->Set + 8))->min_c = '\0';
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar22->Set + 8))->max_c = '\0';
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar22->Set + 8))->ptr_c = '\0';
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar22->Set + 8))->field_0x3 = 0;
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar22->Set + 8))->step = 0;
            glob_00->pattern[sVar1].globindex = local_28c;
            local_28c = local_28c + 1;
            local_270 = 1;
            local_250 = local_2b8;
            local_280 = paVar26;
            local_248 = pUVar28;
LAB_0011c306:
            local_298 = local_250 + 1;
            iVar12 = 1;
            lVar17 = local_270;
            do {
              bVar31 = iVar12 == 0;
              iVar12 = iVar12 + -1;
              uVar21 = local_2a8;
              if (bVar31) {
                pbVar29 = local_288 + local_270;
                local_2b8 = local_298;
                CVar30 = CURLE_OK;
                break;
              }
              bVar10 = pbVar29[lVar17];
              if (bVar10 != 0x2c) {
                if (bVar10 != 0x7d) {
                  if ((bVar10 == 0x7b) || (bVar10 == 0x5b)) {
                    pcVar16 = "nested brace";
LAB_0011c775:
                    glob_00->error = pcVar16;
                    pbVar25 = local_288;
                    local_2b8 = local_298;
                    goto LAB_0011c781;
                  }
                  if (bVar10 == 0x5c) {
                    bVar10 = pbVar29[lVar17 + 1];
                    if (bVar10 == 0) {
                      bVar10 = 0x5c;
                    }
                    else {
                      lVar17 = lVar17 + 1;
                      local_298 = local_250 + 2;
                    }
                  }
                  else {
                    if (bVar10 == 0x5d) {
                      pcVar16 = "unexpected close bracket";
                      goto LAB_0011c775;
                    }
                    if (bVar10 == 0) {
                      glob_00->error = "unmatched brace";
                      glob_00->pos = (size_t)local_2b8;
                      pbVar29 = local_288;
                      local_2b8 = local_298;
                      CVar30 = CURLE_URL_MALFORMAT;
                      break;
                    }
                  }
                  *local_278 = bVar10;
                  local_278 = local_278 + 1;
                  goto LAB_0011c469;
                }
                if (lVar17 == 1) {
                  glob_00->error = "empty string within braces";
                  glob_00->pos = (size_t)local_298;
                  pbVar29 = local_288;
                  local_2b8 = local_298;
                  CVar30 = CURLE_URL_MALFORMAT;
                  break;
                }
                iVar13 = (pUVar28->content).Set.size + 1;
                if (iVar13 == 0) {
                  local_2a8 = 0;
                }
                else {
                  auVar2._8_8_ = 0;
                  auVar2._0_8_ = (long)iVar13;
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = local_2a8;
                  local_2a8 = SUB168(auVar2 * auVar5,0);
                  if (SUB168(auVar2 * auVar5,8) != 0) {
                    glob_00->error = "range overflow";
                    glob_00->pos = 0;
                    CVar30 = CURLE_URL_MALFORMAT;
                    pbVar29 = local_288;
                    local_2b8 = local_298;
                    break;
                  }
                }
              }
              *local_278 = 0;
              if ((paVar26->Set).elements == (char **)0x0) {
                ppcVar18 = (char **)malloc(8);
                (paVar26->Set).elements = ppcVar18;
                if (ppcVar18 != (char **)0x0) goto LAB_0011c3b4;
LAB_0011c5c0:
                glob_00->error = "out of memory";
                glob_00->pos = 0;
                CVar30 = CURLE_OUT_OF_MEMORY;
                pbVar29 = local_288;
                local_2b8 = local_298;
                uVar21 = local_2a8;
                break;
              }
              ppcVar18 = (char **)realloc((paVar26->Set).elements,
                                          (long)(pUVar28->content).Set.size * 8 + 8);
              if (ppcVar18 == (char **)0x0) goto LAB_0011c5c0;
              (local_280->Set).elements = ppcVar18;
LAB_0011c3b4:
              pcVar16 = strdup(glob_00->glob_buffer);
              iVar13 = (local_248->content).Set.size;
              ppcVar18[iVar13] = pcVar16;
              if (pcVar16 == (char *)0x0) goto LAB_0011c5c0;
              (local_248->content).Set.size = iVar13 + 1;
              paVar26 = local_280;
              pUVar28 = local_248;
              if (pbVar29[lVar17] != 0x7d) goto LAB_0011c424;
              lVar17 = lVar17 + 1;
            } while( true );
          }
        }
        else {
          *pbVar25 = 0;
          pcVar16 = glob_00->glob_buffer;
          sVar1 = glob_00->size;
          glob_00->pattern[sVar1].type = UPTSet;
          glob_00->pattern[sVar1].globindex = -1;
          glob_00->pattern[sVar1].content.NumRange.max_n = 1;
          ppcVar18 = (char **)malloc(8);
          glob_00->pattern[sVar1].content.Set.elements = ppcVar18;
          if (ppcVar18 != (char **)0x0) {
            __dest = (char *)malloc(sVar15 + 1);
            *ppcVar18 = __dest;
            if (__dest != (char *)0x0) {
              memcpy(__dest,pcVar16,sVar15);
              __dest[sVar15] = '\0';
              CVar30 = CURLE_OK;
              goto LAB_0011c78c;
            }
          }
          glob_00->error = "out of memory";
          glob_00->pos = 0;
          CVar30 = CURLE_OUT_OF_MEMORY;
        }
LAB_0011c78c:
        local_2a8 = uVar21;
        uVar21 = glob_00->size + 1;
        glob_00->size = uVar21;
      } while (uVar21 < 100);
      pcVar16 = "too many globs";
LAB_0011ca6d:
      glob_00->error = pcVar16;
      glob_00->pos = (size_t)local_2b8;
      CVar30 = CURLE_URL_MALFORMAT;
LAB_0011ca84:
      pFVar8 = local_268;
      if ((local_268 != (FILE *)0x0) &&
         (ppcVar18 = (char **)glob_00->error, ppcVar18 != (char **)0x0)) {
        sVar1 = glob_00->pos;
        if (sVar1 != 0) {
          curl_msnprintf(&endp,0x200,"%s in URL position %zu:\n%s\n%*s^",ppcVar18,sVar1,local_258,
                         (int)sVar1 + -1," ");
          ppcVar18 = &endp;
        }
        curl_mfprintf(pFVar8,"curl: (%d) %s\n",CVar30,ppcVar18);
      }
      glob_cleanup(glob_00);
      *local_260 = 1;
      return CVar30;
    }
    free(pcVar16);
  }
  return CURLE_OUT_OF_MEMORY;
LAB_0011c424:
  local_278 = (byte *)glob_00->glob_buffer;
LAB_0011c469:
  local_270 = lVar17 + 1;
  local_250 = local_298;
  goto LAB_0011c306;
}

Assistant:

CURLcode glob_url(struct URLGlob **glob, char *url, unsigned long *urlnum,
                  FILE *error)
{
  /*
   * We can deal with any-size, just make a buffer with the same length
   * as the specified URL!
   */
  struct URLGlob *glob_expand;
  unsigned long amount = 0;
  char *glob_buffer;
  CURLcode res;

  *glob = NULL;

  glob_buffer = malloc(strlen(url) + 1);
  if(!glob_buffer)
    return CURLE_OUT_OF_MEMORY;
  glob_buffer[0] = 0;

  glob_expand = calloc(1, sizeof(struct URLGlob));
  if(!glob_expand) {
    Curl_safefree(glob_buffer);
    return CURLE_OUT_OF_MEMORY;
  }
  glob_expand->urllen = strlen(url);
  glob_expand->glob_buffer = glob_buffer;

  res = glob_parse(glob_expand, url, 1, &amount);
  if(!res)
    *urlnum = amount;
  else {
    if(error && glob_expand->error) {
      char text[512];
      const char *t;
      if(glob_expand->pos) {
        msnprintf(text, sizeof(text), "%s in URL position %zu:\n%s\n%*s^",
                  glob_expand->error,
                  glob_expand->pos, url, (int)glob_expand->pos - 1, " ");
        t = text;
      }
      else
        t = glob_expand->error;

      /* send error description to the error-stream */
      fprintf(error, "curl: (%d) %s\n", res, t);
    }
    /* it failed, we cleanup */
    glob_cleanup(glob_expand);
    *urlnum = 1;
    return res;
  }

  *glob = glob_expand;
  return CURLE_OK;
}